

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_pps.c
# Opt level: O1

MPP_RET process_pps(H264_SLICE_t *currSlice)

{
  bitread_ctx_t *bitctx;
  h264_pps_t *pps;
  h264d_cur_ctx_t *sps;
  MPP_RET MVar1;
  RK_U32 RVar2;
  h264_pps_t *phVar3;
  char *fmt;
  undefined8 uVar4;
  RK_U32 _out;
  RK_U32 local_34;
  
  sps = currSlice->p_Cur;
  bitctx = &sps->bitctx;
  pps = &sps->pps;
  memset(pps,0,0x8b8);
  MVar1 = mpp_read_ue(bitctx,&local_34);
  (sps->bitctx).ret = MVar1;
  if (MVar1 == MPP_OK) {
    (sps->pps).pic_parameter_set_id = local_34;
    MVar1 = mpp_read_ue(bitctx,&local_34);
    (sps->bitctx).ret = MVar1;
    if (MVar1 == MPP_OK) {
      (sps->pps).seq_parameter_set_id = local_34;
      if (0x1f < local_34) {
        (sps->pps).seq_parameter_set_id = 0;
      }
      if (0xff < (sps->pps).pic_parameter_set_id) {
        (sps->pps).pic_parameter_set_id = 0;
      }
      MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
      (sps->bitctx).ret = MVar1;
      if (MVar1 == MPP_OK) {
        (sps->pps).entropy_coding_mode_flag = local_34;
        MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
        (sps->bitctx).ret = MVar1;
        if (MVar1 == MPP_OK) {
          (sps->pps).bottom_field_pic_order_in_frame_present_flag = local_34;
          MVar1 = mpp_read_ue(bitctx,&local_34);
          (sps->bitctx).ret = MVar1;
          if (MVar1 == MPP_OK) {
            (sps->pps).num_slice_groups_minus1 = local_34;
            if (1 < (int)local_34) {
              MVar1 = MPP_ERR_VALUE;
              if ((h264d_debug & 4) == 0) goto LAB_00191887;
              fmt = "value error(%d).\n";
              uVar4 = 0x52;
LAB_00191bad:
              _mpp_log_l(4,"h264d_pps",fmt,(char *)0x0,uVar4);
              goto LAB_00191887;
            }
            MVar1 = mpp_read_ue(bitctx,&local_34);
            (sps->bitctx).ret = MVar1;
            if (MVar1 == MPP_OK) {
              (sps->pps).num_ref_idx_l0_default_active_minus1 = local_34;
              if (0x1f < (int)local_34) {
                MVar1 = MPP_ERR_VALUE;
                if ((h264d_debug & 4) == 0) goto LAB_00191887;
                fmt = "value error(%d).\n";
                uVar4 = 0x54;
                goto LAB_00191bad;
              }
              MVar1 = mpp_read_ue(bitctx,&local_34);
              (sps->bitctx).ret = MVar1;
              if (MVar1 == MPP_OK) {
                (sps->pps).num_ref_idx_l1_default_active_minus1 = local_34;
                if (0x1f < (int)local_34) {
                  MVar1 = MPP_ERR_VALUE;
                  if ((h264d_debug & 4) == 0) goto LAB_00191887;
                  fmt = "value error(%d).\n";
                  uVar4 = 0x56;
                  goto LAB_00191bad;
                }
                MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                (sps->bitctx).ret = MVar1;
                if (MVar1 == MPP_OK) {
                  (sps->pps).weighted_pred_flag = local_34;
                  MVar1 = mpp_read_bits(bitctx,2,(RK_S32 *)&local_34);
                  (sps->bitctx).ret = MVar1;
                  if (MVar1 == MPP_OK) {
                    (sps->pps).weighted_bipred_idc = local_34;
                    if (2 < (int)local_34) {
                      MVar1 = MPP_ERR_VALUE;
                      if ((h264d_debug & 4) == 0) goto LAB_00191887;
                      fmt = "value error(%d).\n";
                      uVar4 = 0x59;
                      goto LAB_00191bad;
                    }
                    MVar1 = mpp_read_se(bitctx,(RK_S32 *)&local_34);
                    (sps->bitctx).ret = MVar1;
                    if (MVar1 == MPP_OK) {
                      (sps->pps).pic_init_qp_minus26 = local_34;
                      MVar1 = mpp_read_se(bitctx,(RK_S32 *)&local_34);
                      (sps->bitctx).ret = MVar1;
                      if (MVar1 == MPP_OK) {
                        (sps->pps).pic_init_qs_minus26 = local_34;
                        MVar1 = mpp_read_se(bitctx,(RK_S32 *)&local_34);
                        (sps->bitctx).ret = MVar1;
                        if (MVar1 == MPP_OK) {
                          (sps->pps).chroma_qp_index_offset = local_34;
                          (sps->pps).second_chroma_qp_index_offset = local_34;
                          MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                          (sps->bitctx).ret = MVar1;
                          if (MVar1 == MPP_OK) {
                            (sps->pps).deblocking_filter_control_present_flag = local_34;
                            MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                            (sps->bitctx).ret = MVar1;
                            if (MVar1 == MPP_OK) {
                              (sps->pps).constrained_intra_pred_flag = local_34;
                              MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                              (sps->bitctx).ret = MVar1;
                              if (MVar1 == MPP_OK) {
                                (sps->pps).redundant_pic_cnt_present_flag = local_34;
                                if (local_34 != 0) {
                                  MVar1 = MPP_ERR_VALUE;
                                  if ((h264d_debug & 4) == 0) goto LAB_00191887;
                                  fmt = "value error(%d).\n";
                                  uVar4 = 0x61;
                                  goto LAB_00191bad;
                                }
                                RVar2 = mpp_has_more_rbsp_data(bitctx);
                                if (RVar2 == 0) {
                                  (sps->pps).transform_8x8_mode_flag = 0;
                                  local_34 = (sps->pps).chroma_qp_index_offset;
LAB_00191d2a:
                                  (sps->pps).second_chroma_qp_index_offset = local_34;
                                  pps->Valid = 1;
                                  MVar1 = MPP_OK;
                                  goto LAB_00191887;
                                }
                                MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                                (sps->bitctx).ret = MVar1;
                                if (MVar1 == MPP_OK) {
                                  (sps->pps).transform_8x8_mode_flag = local_34;
                                  MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_34);
                                  (sps->bitctx).ret = MVar1;
                                  if (MVar1 == MPP_OK) {
                                    (sps->pps).pic_scaling_matrix_present_flag = local_34;
                                    if (local_34 != 0) {
                                      if ((h264d_debug & 4) != 0) {
                                        _mpp_log_l(4,"h264d_pps","Picture scaling matrix present.",
                                                   (char *)0x0);
                                      }
                                      MVar1 = parse_pps_calingLists(bitctx,&sps->sps,pps);
                                      if (MVar1 < MPP_OK) {
                                        if ((h264d_debug & 4) == 0) goto LAB_00191887;
                                        fmt = "Function error(%d).\n";
                                        uVar4 = 0x68;
                                        goto LAB_00191bad;
                                      }
                                    }
                                    MVar1 = mpp_read_se(bitctx,(RK_S32 *)&local_34);
                                    (sps->bitctx).ret = MVar1;
                                    if (MVar1 == MPP_OK) goto LAB_00191d2a;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  MVar1 = (sps->bitctx).ret;
LAB_00191887:
  if (MVar1 < MPP_OK) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_pps","Function error(%d).\n",(char *)0x0,0x8c);
    }
  }
  else {
    if ((((h264d_debug & 2) != 0) && (pps->Valid != 1)) &&
       (_mpp_log_l(2,"h264d_pps","Assertion %s failed at %s:%d\n",(char *)0x0,"cur_pps->Valid == 1",
                   "process_pps",0x8e), (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    if (currSlice->p_Vid->ppsSet[(sps->pps).pic_parameter_set_id] == (h264_pps_t *)0x0) {
      phVar3 = (h264_pps_t *)mpp_osal_calloc("process_pps",0x8b8);
      currSlice->p_Vid->ppsSet[(sps->pps).pic_parameter_set_id] = phVar3;
    }
    memcpy(currSlice->p_Vid->ppsSet[(sps->pps).pic_parameter_set_id],pps,0x8b8);
    sps->p_Vid->spspps_update = 1;
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET process_pps(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    H264_PPS_t *cur_pps = &p_Cur->pps;

    reset_curpps_data(cur_pps);// reset

    FUN_CHECK(ret = parser_pps(p_bitctx, &p_Cur->sps, cur_pps));
    //!< MakePPSavailable
    ASSERT(cur_pps->Valid == 1);
    if (!currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id]) {
        currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id] = mpp_calloc(H264_PPS_t, 1);
    }

    memcpy(currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id], cur_pps, sizeof(H264_PPS_t));
    p_Cur->p_Vid->spspps_update = 1;

    return ret = MPP_OK;
__FAILED:
    return ret;
}